

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O1

JavascriptString * Js::JavascriptConversion::ToLocaleString(Var aValue,ScriptContext *scriptContext)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  Attributes attributes;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  Var aValue_00;
  JavascriptMethod p_Var8;
  JavascriptTypedNumber<long> *pJVar9;
  JavascriptTypedNumber<unsigned_long> *pJVar10;
  JavascriptSymbol *this_00;
  JavascriptBoolean *pJVar11;
  JavascriptString *pJVar12;
  PropertyRecord *pPVar13;
  ulong uVar14;
  Type *this_01;
  Type TVar15;
  double value;
  undefined1 auVar16 [16];
  
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00a9932a;
    *puVar6 = 0;
  }
  uVar14 = (ulong)aValue & 0xffff000000000000;
  bVar3 = ((ulong)aValue & 0x1ffff00000000) != 0x1000000000000;
  if (bVar3 && uVar14 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00a9932a;
    *puVar6 = 0;
  }
  TVar15 = TypeIds_FirstNumberType;
  if ((uVar14 != 0x1000000000000) && (TVar15 = TypeIds_Number, (ulong)aValue >> 0x32 == 0)) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00a9932a;
      *puVar6 = 0;
    }
    TVar15 = ((pRVar7->type).ptr)->typeId;
    if ((0x57 < (int)TVar15) && (BVar5 = RecyclableObject::IsExternal(pRVar7), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00a9932a;
      *puVar6 = 0;
    }
  }
  switch(TVar15) {
  case TypeIds_Undefined:
    pJVar12 = StringCache::GetUndefinedDisplay
                        (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache)
    ;
    return pJVar12;
  case TypeIds_Null:
    pJVar12 = StringCache::GetNullDisplay
                        (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache)
    ;
    return pJVar12;
  case TypeIds_Boolean:
    pJVar11 = UnsafeVarTo<Js::JavascriptBoolean>(aValue);
    this_01 = &((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache;
    if (pJVar11->value != 0) {
      pJVar12 = StringCache::GetTrueDisplay(this_01);
      return pJVar12;
    }
    pJVar12 = StringCache::GetFalseDisplay(this_01);
    return pJVar12;
  case TypeIds_FirstNumberType:
    if (bVar3 && uVar14 == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00a9932a;
      *puVar6 = 0;
    }
    if (uVar14 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar3) {
LAB_00a9932a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    value = (double)(int)aValue;
    break;
  case TypeIds_Number:
    if ((ulong)aValue >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar3) goto LAB_00a9932a;
      *puVar6 = 0;
    }
    value = (double)((ulong)aValue ^ 0xfffc000000000000);
    break;
  case TypeIds_Int64Number:
    pJVar9 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
    value = (double)pJVar9->m_value;
    break;
  case TypeIds_LastNumberType:
    pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
    auVar16._0_8_ = (double)CONCAT44(0x43300000,(int)pJVar10->m_value);
    auVar16._8_4_ = (int)(pJVar10->m_value >> 0x20);
    auVar16._12_4_ = 0x45300000;
    value = (auVar16._0_8_ - 4503599627370496.0) + (auVar16._8_8_ - 1.9342813113834067e+25);
    break;
  default:
    pRVar7 = VarTo<Js::RecyclableObject>(aValue);
    aValue_00 = JavascriptOperators::GetProperty
                          (pRVar7,0x172,scriptContext,(PropertyValueInfo *)0x0);
    bVar3 = IsCallable(aValue_00);
    if (!bVar3) {
      pPVar13 = ScriptContext::GetPropertyName(scriptContext,0x172);
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec45,(PCWSTR)(pPVar13 + 1));
    }
    pRVar7 = VarTo<Js::RecyclableObject>(aValue_00);
    this = scriptContext->threadContext;
    bVar3 = this->reentrancySafeOrHandled;
    this->reentrancySafeOrHandled = true;
    attributes = FunctionInfo::GetAttributes(pRVar7);
    bVar4 = ThreadContext::HasNoSideEffect(this,pRVar7,attributes);
    if (bVar4) {
      ThreadContext::CheckAndResetReentrancySafeOrHandled(scriptContext->threadContext);
      if (scriptContext->threadContext->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var8 = RecyclableObject::GetEntryPoint(pRVar7);
      CheckIsExecutable(pRVar7,p_Var8);
      p_Var8 = RecyclableObject::GetEntryPoint(pRVar7);
      pRVar7 = (RecyclableObject *)(*p_Var8)(pRVar7,(CallInfo)pRVar7,1,0,0,0,0,1,aValue);
      bVar4 = ThreadContext::IsOnStack(pRVar7);
    }
    else {
      if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
        this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_ToPrimitive;
        pRVar7 = (((((((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                     scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
        goto LAB_00a99279;
      }
      if ((attributes & HasNoSideEffect) == None) {
        IVar1 = this->implicitCallFlags;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(scriptContext->threadContext);
        if (scriptContext->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var8 = RecyclableObject::GetEntryPoint(pRVar7);
        CheckIsExecutable(pRVar7,p_Var8);
        p_Var8 = RecyclableObject::GetEntryPoint(pRVar7);
        pRVar7 = (RecyclableObject *)(*p_Var8)(pRVar7,(CallInfo)pRVar7,1,0,0,0,0,1,aValue);
        this->implicitCallFlags = IVar1 | ImplicitCall_ToPrimitive;
        goto LAB_00a99279;
      }
      ThreadContext::CheckAndResetReentrancySafeOrHandled(scriptContext->threadContext);
      if (scriptContext->threadContext->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var8 = RecyclableObject::GetEntryPoint(pRVar7);
      CheckIsExecutable(pRVar7,p_Var8);
      p_Var8 = RecyclableObject::GetEntryPoint(pRVar7);
      pRVar7 = (RecyclableObject *)(*p_Var8)(pRVar7,(CallInfo)pRVar7,1,0,0,0,0,1,aValue);
      bVar4 = ThreadContext::IsOnStack(pRVar7);
    }
    if (bVar4 != false) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_ToPrimitive;
    }
LAB_00a99279:
    this->reentrancySafeOrHandled = bVar3;
    bVar3 = VarIs<Js::JavascriptString>(pRVar7);
    if (bVar3) {
      pJVar12 = UnsafeVarTo<Js::JavascriptString>(pRVar7);
      return pJVar12;
    }
    pJVar12 = ToString(pRVar7,scriptContext);
    return pJVar12;
  case TypeIds_Symbol:
    this_00 = UnsafeVarTo<Js::JavascriptSymbol>(aValue);
    pJVar12 = JavascriptSymbol::ToString(this_00,scriptContext);
    return pJVar12;
  }
  pJVar12 = JavascriptNumber::ToLocaleString(value,scriptContext);
  return pJVar12;
}

Assistant:

JavascriptString *JavascriptConversion::ToLocaleString(Var aValue, ScriptContext* scriptContext)
    {
        switch (JavascriptOperators::GetTypeId(aValue))
        {
        case TypeIds_Undefined:
            return scriptContext->GetLibrary()->GetUndefinedDisplayString();

        case TypeIds_Null:
            return scriptContext->GetLibrary()->GetNullDisplayString();

        case TypeIds_Integer:
            return JavascriptNumber::ToLocaleString(TaggedInt::ToInt32(aValue), scriptContext);

        case TypeIds_Boolean:
            return UnsafeVarTo<JavascriptBoolean>(aValue)->GetValue() ? scriptContext->GetLibrary()->GetTrueDisplayString() : scriptContext->GetLibrary()->GetFalseDisplayString();

        case TypeIds_Int64Number:
            return JavascriptNumber::ToLocaleString((double)UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue(), scriptContext);

        case TypeIds_UInt64Number:
            return JavascriptNumber::ToLocaleString((double)UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue(), scriptContext);

        case TypeIds_Number:
            return JavascriptNumber::ToLocaleString(JavascriptNumber::GetValue(aValue), scriptContext);

        case TypeIds_Symbol:
            return UnsafeVarTo<JavascriptSymbol>(aValue)->ToString(scriptContext);

        default:
            {
                RecyclableObject* object = VarTo<RecyclableObject>(aValue);
                Var value = JavascriptOperators::GetProperty(object, PropertyIds::toLocaleString, scriptContext, NULL);

                if (JavascriptConversion::IsCallable(value))
                {
                    RecyclableObject* toLocaleStringFunction = VarTo<RecyclableObject>(value);
                    Var aResult = scriptContext->GetThreadContext()->ExecuteImplicitCall(toLocaleStringFunction, Js::ImplicitCall_ToPrimitive, [=]()->Js::Var
                    {
                        return CALL_FUNCTION(scriptContext->GetThreadContext(), toLocaleStringFunction, CallInfo(1), aValue);
                    });
                    if (VarIs<JavascriptString>(aResult))
                    {
                        return UnsafeVarTo<JavascriptString>(aResult);
                    }
                    else
                    {
                        return JavascriptConversion::ToString(aResult, scriptContext);
                    }
                }

                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction, scriptContext->GetPropertyName(PropertyIds::toLocaleString)->GetBuffer());
            }
        }
    }